

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O2

void google::protobuf::compiler::php::anon_unknown_2::GenerateCEnum
               (EnumDescriptor *desc,Printer *printer)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_3;
  FileDescriptor *file;
  int i;
  long lVar1;
  long lVar2;
  allocator local_f2;
  allocator local_f1;
  Printer *local_f0;
  string php_name;
  string local_c8;
  undefined1 local_a8 [16];
  _Rb_tree_node_base local_98;
  size_t local_78;
  string c_name;
  string local_50;
  
  local_f0 = printer;
  std::__cxx11::string::string((string *)&c_name,(string *)(*(long *)(desc + 8) + 0x20));
  std::__cxx11::string::string((string *)&php_name,".",(allocator *)&local_50);
  std::__cxx11::string::string((string *)&local_c8,"_",&local_f2);
  StringReplace((string *)local_a8,&c_name,&php_name,&local_c8,true);
  std::__cxx11::string::operator=((string *)&c_name,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&php_name);
  local_98._M_left = &local_98;
  local_98._0_8_ = 0;
  local_98._M_parent = (_Base_ptr)0x0;
  local_a8._0_8_ = (pointer)0x0;
  local_a8._8_8_ = 0;
  local_78 = 0;
  local_98._M_right = local_98._M_left;
  FullClassName<google::protobuf::EnumDescriptor>(&php_name,desc,(Options *)local_a8);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_a8 + 8));
  std::__cxx11::string::string((string *)&local_c8,"\\",&local_f2);
  std::__cxx11::string::string((string *)&local_50,"\\\\",&local_f1);
  StringReplace((string *)local_a8,&php_name,&local_c8,&local_50,true);
  std::__cxx11::string::operator=((string *)&php_name,(string *)local_a8);
  std::__cxx11::string::~string((string *)local_a8);
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&local_c8);
  lVar2 = *(long *)(desc + 8);
  (anonymous_namespace)::FilenameCName_abi_cxx11_
            ((string *)local_a8,*(_anonymous_namespace_ **)(desc + 0x10),file);
  io::Printer::
  Print<char[5],std::__cxx11::string,char[12],std::__cxx11::string,char[7],std::__cxx11::string,char[9],std::__cxx11::string>
            (local_f0,
             "/* $c_name$ */\n\nzend_class_entry* $c_name$_ce;\n\nPHP_METHOD($c_name$, name) {\n  $file_c_name$_AddDescriptor();\n  const upb_symtab *symtab = DescriptorPool_GetSymbolTable();\n  const upb_enumdef *e = upb_symtab_lookupenum(symtab, \"$name$\");\n  const char *name;\n  zend_long value;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"l\", &value) ==\n      FAILURE) {\n    return;\n  }\n  name = upb_enumdef_iton(e, value);\n  if (!name) {\n    zend_throw_exception_ex(NULL, 0,\n                            \"$php_name$ has no name \"\n                            \"defined for value \" ZEND_LONG_FMT \".\",\n                            value);\n    return;\n  }\n  RETURN_STRING(name);\n}\n\nPHP_METHOD($c_name$, value) {\n  $file_c_name$_AddDescriptor();\n  const upb_symtab *symtab = DescriptorPool_GetSymbolTable();\n  const upb_enumdef *e = upb_symtab_lookupenum(symtab, \"$name$\");\n  char *name = NULL;\n  size_t name_len;\n  int32_t num;\n  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"s\", &name,\n                            &name_len) == FAILURE) {\n    return;\n  }\n  if (!upb_enumdef_ntoi(e, name, name_len, &num)) {\n    zend_throw_exception_ex(NULL, 0,\n                            \"$php_name$ has no value \"\n                            \"defined for name %s.\",\n                            name);\n    return;\n  }\n  RETURN_LONG(num);\n}\n\nstatic zend_function_entry $c_name$_phpmethods[] = {\n  PHP_ME($c_name$, name, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n  PHP_ME($c_name$, value, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n  ZEND_FE_END\n};\n\nstatic void $c_name$_ModuleInit() {\n  zend_class_entry tmp_ce;\n\n  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n                   $c_name$_phpmethods);\n\n  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n"
             ,(char (*) [5])0x3de831,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(lVar2 + 0x20),
             (char (*) [12])"file_c_name",(string *)local_a8,(char (*) [7])0x3dcf9c,&c_name,
             (char (*) [9])"php_name",&php_name);
  std::__cxx11::string::~string((string *)local_a8);
  lVar2 = 8;
  for (lVar1 = 0; lVar1 < *(int *)(desc + 4); lVar1 = lVar1 + 1) {
    args_3 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
              (*(long *)(desc + 0x28) + lVar2);
    std::__cxx11::to_string((string *)local_a8,*(int *)(*(long *)(desc + 0x28) + -4 + lVar2));
    io::Printer::
    Print<char[7],std::__cxx11::string,char[5],std::__cxx11::string,char[4],std::__cxx11::string>
              (local_f0,
               "  zend_declare_class_constant_long($c_name$_ce, \"$name$\",\n                                   strlen(\"$name$\"), $num$);\n"
               ,(char (*) [7])0x3dcf9c,&c_name,(char (*) [5])0x3de831,args_3,(char (*) [4])0x3d93fc,
               (string *)local_a8);
    std::__cxx11::string::~string((string *)local_a8);
    lVar2 = lVar2 + 0x20;
  }
  io::Printer::Print<>(local_f0,"}\n\n");
  std::__cxx11::string::~string((string *)&php_name);
  std::__cxx11::string::~string((string *)&c_name);
  return;
}

Assistant:

void GenerateCEnum(const EnumDescriptor* desc, io::Printer* printer) {
  std::string c_name = desc->full_name();
  c_name = StringReplace(c_name, ".", "_", true);
  std::string php_name = FullClassName(desc, Options());
  php_name = StringReplace(php_name, "\\", "\\\\", true);
  printer->Print(
      "/* $c_name$ */\n"
      "\n"
      "zend_class_entry* $c_name$_ce;\n"
      "\n"
      "PHP_METHOD($c_name$, name) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  const upb_symtab *symtab = DescriptorPool_GetSymbolTable();\n"
      "  const upb_enumdef *e = upb_symtab_lookupenum(symtab, \"$name$\");\n"
      "  const char *name;\n"
      "  zend_long value;\n"
      "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"l\", &value) ==\n"
      "      FAILURE) {\n"
      "    return;\n"
      "  }\n"
      "  name = upb_enumdef_iton(e, value);\n"
      "  if (!name) {\n"
      "    zend_throw_exception_ex(NULL, 0,\n"
      "                            \"$php_name$ has no name \"\n"
      "                            \"defined for value \" ZEND_LONG_FMT \".\",\n"
      "                            value);\n"
      "    return;\n"
      "  }\n"
      "  RETURN_STRING(name);\n"
      "}\n"
      "\n"
      "PHP_METHOD($c_name$, value) {\n"
      "  $file_c_name$_AddDescriptor();\n"
      "  const upb_symtab *symtab = DescriptorPool_GetSymbolTable();\n"
      "  const upb_enumdef *e = upb_symtab_lookupenum(symtab, \"$name$\");\n"
      "  char *name = NULL;\n"
      "  size_t name_len;\n"
      "  int32_t num;\n"
      "  if (zend_parse_parameters(ZEND_NUM_ARGS(), \"s\", &name,\n"
      "                            &name_len) == FAILURE) {\n"
      "    return;\n"
      "  }\n"
      "  if (!upb_enumdef_ntoi(e, name, name_len, &num)) {\n"
      "    zend_throw_exception_ex(NULL, 0,\n"
      "                            \"$php_name$ has no value \"\n"
      "                            \"defined for name %s.\",\n"
      "                            name);\n"
      "    return;\n"
      "  }\n"
      "  RETURN_LONG(num);\n"
      "}\n"
      "\n"
      "static zend_function_entry $c_name$_phpmethods[] = {\n"
      "  PHP_ME($c_name$, name, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n"
      "  PHP_ME($c_name$, value, arginfo_lookup, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n"
      "  ZEND_FE_END\n"
      "};\n"
      "\n"
      "static void $c_name$_ModuleInit() {\n"
      "  zend_class_entry tmp_ce;\n"
      "\n"
      "  INIT_CLASS_ENTRY(tmp_ce, \"$php_name$\",\n"
      "                   $c_name$_phpmethods);\n"
      "\n"
      "  $c_name$_ce = zend_register_internal_class(&tmp_ce);\n",
      "name", desc->full_name(),
      "file_c_name", FilenameCName(desc->file()),
      "c_name", c_name,
      "php_name", php_name);

  for (int i = 0; i < desc->value_count(); i++) {
    const EnumValueDescriptor* value = desc->value(i);
    printer->Print(
        "  zend_declare_class_constant_long($c_name$_ce, \"$name$\",\n"
        "                                   strlen(\"$name$\"), $num$);\n",
        "c_name", c_name,
        "name", value->name(),
        "num", std::to_string(value->number()));
  }

  printer->Print(
      "}\n"
      "\n");
}